

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

int archive_write_pax_header_xattrs(archive_write *a,pax *pax,archive_entry *entry)

{
  char cVar1;
  char cVar2;
  char *p;
  char *value_00;
  archive_string *paVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  byte *pbVar6;
  size_t sVar7;
  char *value_01;
  byte *__s;
  char *pcVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  byte *pbVar14;
  byte bVar15;
  size_t size;
  void *value;
  char *name;
  archive_string local_98;
  ulong local_78;
  archive_string *local_70;
  archive_write *local_68;
  ulong local_60;
  char *local_58;
  byte *local_50;
  char *local_48;
  archive_entry *local_40;
  archive_string *local_38;
  
  wVar4 = archive_entry_xattr_reset(entry);
  if (wVar4 != L'\0') {
    local_38 = &pax->l_url_encoded_name;
    local_70 = &pax->pax_header;
    local_68 = a;
    local_40 = entry;
    do {
      archive_entry_xattr_next(local_40,(char **)&local_50,&local_58,&local_60);
      bVar15 = *local_50;
      if (bVar15 == 0) {
        pbVar6 = (byte *)malloc(1);
        __s = pbVar6;
        if (pbVar6 == (byte *)0x0) goto LAB_0017ad2b;
      }
      else {
        pbVar14 = local_50 + 1;
        uVar13 = 0;
        pbVar6 = pbVar14;
        bVar9 = bVar15;
        do {
          if (((((char)bVar9 < '!') || (bVar9 == 0x25)) || (bVar9 == 0x7f)) || (bVar9 == 0x3d)) {
            lVar11 = 3;
            if (0xfffffffffffffffb < uVar13) goto LAB_0017ad2b;
          }
          else {
            lVar11 = 1;
            if (0xfffffffffffffffd < uVar13) goto LAB_0017ad2b;
          }
          uVar13 = uVar13 + lVar11;
          bVar9 = *pbVar6;
          pbVar6 = pbVar6 + 1;
        } while (bVar9 != 0);
        __s = (byte *)malloc(uVar13 + 1);
        pbVar6 = __s;
        if (__s == (byte *)0x0) goto LAB_0017ad2b;
        do {
          if ((((char)bVar15 < '!') || (bVar15 == 0x25)) || ((bVar15 == 0x7f || (bVar15 == 0x3d))))
          {
            *pbVar6 = 0x25;
            pbVar6[1] = "0123456789ABCDEF"[bVar15 >> 4];
            pbVar6[2] = "0123456789ABCDEF"[bVar15 & 0xf];
            pbVar6 = pbVar6 + 3;
          }
          else {
            *pbVar6 = bVar15;
            pbVar6 = pbVar6 + 1;
          }
          bVar15 = *pbVar14;
          pbVar14 = pbVar14 + 1;
        } while (bVar15 != 0);
      }
      *pbVar6 = 0;
      sVar7 = strlen((char *)__s);
      paVar3 = local_38;
      wVar5 = archive_strncpy_l(local_38,__s,sVar7,pax->sconv_utf8);
      free(__s);
      value_00 = local_58;
      if (wVar5 != L'\0') {
        if (wVar5 != L'\xffffffff') {
          archive_set_error(&local_68->archive,-1,"Error encoding pax extended attribute");
          return -0x19;
        }
LAB_0017ad2b:
        archive_set_error(&local_68->archive,0xc,"Can\'t allocate memory");
        return -0x1e;
      }
      p = paVar3->s;
      if (p != (char *)0x0) {
        uVar10 = pax->flags;
        uVar13 = local_60;
        if ((uVar10 & 2) != 0) {
          local_78 = local_60;
          value_01 = (char *)malloc((local_60 * 4 + 2) / 3 + 1);
          pcVar8 = value_01;
          uVar13 = local_78;
          pcVar12 = value_00;
          if (value_01 != (char *)0x0) {
            for (; 2 < uVar13; uVar13 = uVar13 - 3) {
              cVar1 = *pcVar12;
              cVar2 = pcVar12[1];
              bVar15 = pcVar12[2];
              *pcVar8 = base64_encode_digits[(uint)(int)cVar1 >> 2 & 0x3f];
              pcVar8[1] = base64_encode_digits
                          [(((int)cVar2 & 0xf0U) << 8 | ((int)cVar1 & 3U) << 0x10) >> 0xc];
              pcVar8[2] = base64_encode_digits[(uint)(int)CONCAT11(cVar2,bVar15) >> 6 & 0x3f];
              pcVar8[3] = base64_encode_digits[bVar15 & 0x3f];
              pcVar8 = pcVar8 + 4;
              pcVar12 = pcVar12 + 3;
            }
            if (uVar13 == 2) {
              cVar1 = *pcVar12;
              cVar2 = pcVar12[1];
              *pcVar8 = base64_encode_digits[(uint)(int)cVar1 >> 2 & 0x3f];
              pcVar12 = pcVar8 + 2;
              pcVar8[1] = base64_encode_digits
                          [(((int)cVar2 & 0xf0U) << 8 | ((int)cVar1 & 3U) << 0x10) >> 0xc];
              uVar10 = ((int)cVar2 & 0xfU) << 2;
              lVar11 = 3;
LAB_0017ac26:
              pcVar8 = pcVar8 + lVar11;
              *pcVar12 = base64_encode_digits[uVar10];
            }
            else if (uVar13 == 1) {
              cVar1 = *pcVar12;
              pcVar12 = pcVar8 + 1;
              *pcVar8 = base64_encode_digits[(uint)(int)cVar1 >> 2 & 0x3f];
              uVar10 = ((int)cVar1 & 3U) << 4;
              lVar11 = 2;
              goto LAB_0017ac26;
            }
            *pcVar8 = '\0';
            local_98.s = (char *)0x0;
            local_98.length = 0;
            local_98.buffer_length = 0;
            local_48 = value_01;
            archive_strncat(&local_98,"LIBARCHIVE.xattr.",0x11);
            archive_strcat(&local_98,p);
            value_01 = local_48;
            pcVar8 = local_98.s;
            sVar7 = strlen(local_48);
            add_pax_attr_binary(local_70,pcVar8,value_01,sVar7);
            archive_string_free(&local_98);
            uVar10 = pax->flags;
          }
          free(value_01);
          uVar13 = local_78;
        }
        if ((uVar10 & 1) != 0) {
          local_98.s = (char *)0x0;
          local_98.length = 0;
          local_98.buffer_length = 0;
          archive_strncat(&local_98,"SCHILY.xattr.",0xd);
          archive_strcat(&local_98,p);
          add_pax_attr_binary(local_70,local_98.s,value_00,uVar13);
          archive_string_free(&local_98);
        }
      }
      wVar4 = wVar4 + L'\xffffffff';
    } while (wVar4 != L'\0');
  }
  return 0;
}

Assistant:

static int
archive_write_pax_header_xattrs(struct archive_write *a,
    struct pax *pax, struct archive_entry *entry)
{
	int i = archive_entry_xattr_reset(entry);

	while (i--) {
		const char *name;
		const void *value;
		char *url_encoded_name = NULL, *encoded_name = NULL;
		size_t size;
		int r;

		archive_entry_xattr_next(entry, &name, &value, &size);
		url_encoded_name = url_encode(name);
		if (url_encoded_name == NULL)
			goto malloc_error;
		else {
			/* Convert narrow-character to UTF-8. */
			r = archive_strcpy_l(&(pax->l_url_encoded_name),
			    url_encoded_name, pax->sconv_utf8);
			free(url_encoded_name); /* Done with this. */
			if (r == 0)
				encoded_name = pax->l_url_encoded_name.s;
			else if (r == -1)
				goto malloc_error;
			else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Error encoding pax extended attribute");
				return (ARCHIVE_FAILED);
			}
		}

		archive_write_pax_header_xattr(pax, encoded_name,
		    value, size);

	}
	return (ARCHIVE_OK);
malloc_error:
	archive_set_error(&a->archive, ENOMEM, "Can't allocate memory");
	return (ARCHIVE_FATAL);
}